

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasmFPU_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmFGeneric<(moira::Instr)195,(moira::Mode)12,0>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  int iVar1;
  Syntax SVar2;
  char *pcVar3;
  char cVar4;
  uint uVar5;
  long lVar6;
  
  *addr = *addr + 2;
  uVar5 = (*this->_vptr_Moira[6])();
  uVar5 = uVar5 & 0xffff;
  cVar4 = 'f';
  lVar6 = 0;
  if ((uVar5 >> 0xe & 1) == 0) {
    do {
      pcVar3 = str->ptr;
      str->ptr = pcVar3 + 1;
      *pcVar3 = cVar4;
      cVar4 = "fneg"[lVar6 + 1];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    StrWriter::operator<<(str,(Ffmt)0x2);
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar3 = str->ptr;
      str->ptr = pcVar3 + 1;
      *pcVar3 = ' ';
    }
    else {
      iVar1 = (str->tab).raw;
      do {
        pcVar3 = str->ptr;
        str->ptr = pcVar3 + 1;
        *pcVar3 = ' ';
      } while (str->ptr < str->base + iVar1);
    }
    StrWriter::operator<<(str,(Fp)(uVar5 >> 10 & 7));
  }
  else {
    do {
      pcVar3 = str->ptr;
      str->ptr = pcVar3 + 1;
      *pcVar3 = cVar4;
      cVar4 = "fneg"[lVar6 + 1];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    StrWriter::operator<<(str,(Ffmt)(uVar5 >> 10 & 7));
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar3 = str->ptr;
      str->ptr = pcVar3 + 1;
      *pcVar3 = ' ';
    }
    else {
      iVar1 = (str->tab).raw;
      do {
        pcVar3 = str->ptr;
        str->ptr = pcVar3 + 1;
        *pcVar3 = ' ';
      } while (str->ptr < str->base + iVar1);
    }
    cVar4 = '?';
    lVar6 = 1;
    do {
      pcVar3 = str->ptr;
      str->ptr = pcVar3 + 1;
      *pcVar3 = cVar4;
      cVar4 = "???"[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
  }
  pcVar3 = str->ptr;
  str->ptr = pcVar3 + 1;
  *pcVar3 = ',';
  SVar2 = str->style->syntax;
  if ((SVar2 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar2 & 0x1f) & 1) != 0)) {
    pcVar3 = str->ptr;
    str->ptr = pcVar3 + 1;
    *pcVar3 = ' ';
  }
  StrWriter::operator<<(str,(Fp)(uVar5 >> 7 & 7));
  return;
}

Assistant:

void
Moira::dasmFGeneric(StrWriter &str, u32 &addr, u16 op) const
{
    auto ext = dasmIncRead(addr);
    auto reg = _____________xxx (op);
    auto src = ___xxx__________ (ext);
    auto dst = ______xxx_______ (ext);

    if (ext & 0x4000) {

        if (M == Mode::IM) {

            u64 val;

            switch (src) {

                case 0: // Long-Word Integer

                    val = dasmIncRead<Long>(addr);
                    str << Ins<I>{} << Ffmt{src} << str.tab << Ims<Long>(u32(val));
                    break;

                case 1: // Single precision

                    val = dasmIncRead<Long>(addr);
                    str << Ins<I>{} << Ffmt{src} << str.tab << "#<fixme>";
                    break;

                case 2: // Double precision
                case 3: // Packed-Decimal Real

                    val = dasmIncRead<Long>(addr);
                    dasmIncRead<Long>(addr);
                    dasmIncRead<Long>(addr); // Why???
                    str << Ins<I>{} << Ffmt{src} << str.tab << "#<fixme>";
                    break;

                case 5: // Double-precision real

                    val = dasmIncRead<Long>(addr);
                    dasmIncRead<Long>(addr);
                    str << Ins<I>{} << Ffmt{src} << str.tab << "#<fixme>";
                    break;

                case 6: // Byte Integer
                    val = dasmIncRead<Word>(addr);
                    str << Ins<I>{} << Ffmt{src} << str.tab << Ims<Byte>(u32(val));
                    break;

                default:
                    str << Ins<I>{} << Ffmt{src} << str.tab << Op<M, Word>(reg, addr);
            }
        } else {
            str << Ins<I>{} << Ffmt{src} << str.tab << Op<M, Long>(reg, addr);
        }

    } else {
        str << Ins<I>{} << Ffmt{2} << str.tab << Fp{src};
    }

    str << Sep{} << Fp{dst};
}